

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::NavScoreItem(ImGuiNavItemData *result)

{
  float *pfVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  uint uVar8;
  ImRect *pIVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ImVec2 IVar18;
  float fVar19;
  float fVar20;
  float local_28 [4];
  float local_18 [6];
  
  pIVar6 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  if (GImGui->NavLayer != (pIVar5->DC).NavLayerCurrent) {
    return false;
  }
  local_18[0] = (GImGui->LastItemData).NavRect.Min.x;
  fVar12 = (GImGui->LastItemData).NavRect.Min.y;
  local_28[0] = (GImGui->LastItemData).NavRect.Max.x;
  fVar11 = (GImGui->LastItemData).NavRect.Max.y;
  IVar2 = (GImGui->NavScoringRect).Min;
  IVar3 = (GImGui->NavScoringRect).Max;
  GImGui->NavScoringDebugCount = GImGui->NavScoringDebugCount + 1;
  local_28[1] = fVar11;
  local_18[1] = fVar12;
  if (pIVar5->ParentWindow == pIVar6->NavWindow) {
    if ((pIVar5->ClipRect).Max.y <= fVar12) {
      return false;
    }
    pfVar1 = &(pIVar5->ClipRect).Min.y;
    if (fVar11 < *pfVar1 || fVar11 == *pfVar1) {
      return false;
    }
    if ((pIVar5->ClipRect).Max.x <= local_18[0]) {
      return false;
    }
    if (local_28[0] < (pIVar5->ClipRect).Min.x || local_28[0] == (pIVar5->ClipRect).Min.x) {
      return false;
    }
    IVar18 = (pIVar5->ClipRect).Max;
    local_28[1] = (pIVar5->ClipRect).Min.y;
    fVar15 = (pIVar5->ClipRect).Min.x;
    fVar16 = IVar18.x;
    local_18[1] = local_28[1];
    if ((local_28[1] <= fVar12) && (local_18[1] = IVar18.y, fVar12 <= IVar18.y)) {
      local_18[1] = fVar12;
    }
    fVar12 = fVar16;
    if (local_18[0] <= fVar16) {
      fVar12 = local_18[0];
    }
    local_18[0] = (float)(-(uint)(local_18[0] < fVar15) & (uint)fVar15 |
                         ~-(uint)(local_18[0] < fVar15) & (uint)fVar12);
    if ((local_28[1] <= fVar11) && (local_28[1] = IVar18.y, fVar11 <= IVar18.y)) {
      local_28[1] = fVar11;
    }
    if (local_28[0] <= fVar16) {
      IVar18.x = local_28[0];
    }
    local_28[0] = (float)(-(uint)(local_28[0] < fVar15) & (uint)fVar15 |
                         ~-(uint)(local_28[0] < fVar15) & (uint)IVar18.x);
  }
  bVar7 = 1 < (uint)pIVar6->NavMoveClipDir;
  if (bVar7) {
    pIVar9 = &pIVar5->ClipRect;
    lVar10 = 0x220;
    fVar11 = local_18[0];
  }
  else {
    pIVar9 = (ImRect *)&(pIVar5->ClipRect).Min.y;
    lVar10 = 0x224;
    fVar11 = local_18[1];
  }
  bVar7 = !bVar7;
  fVar12 = (pIVar9->Min).x;
  fVar15 = *(float *)((long)&pIVar5->Name + lVar10);
  fVar16 = fVar15;
  if (fVar11 <= fVar15) {
    fVar16 = fVar11;
  }
  local_18[bVar7] =
       (float)(-(uint)(fVar11 < fVar12) & (uint)fVar12 | ~-(uint)(fVar11 < fVar12) & (uint)fVar16);
  fVar11 = local_28[bVar7];
  if (fVar11 <= fVar15) {
    fVar15 = fVar11;
  }
  local_28[bVar7] =
       (float)(-(uint)(fVar11 < fVar12) & (uint)fVar12 | ~-(uint)(fVar11 < fVar12) & (uint)fVar15);
  fVar11 = IVar2.x;
  fVar12 = IVar3.x;
  if (fVar11 <= local_28[0]) {
    fVar15 = 0.0;
    if (fVar12 < local_18[0]) {
      fVar15 = local_18[0] - fVar12;
    }
  }
  else {
    fVar15 = local_28[0] - fVar11;
  }
  fVar14 = IVar3.y;
  fVar13 = IVar2.y;
  fVar19 = fVar14 - fVar13;
  fVar16 = (local_28[1] - local_18[1]) * 0.8 + local_18[1];
  fVar17 = fVar19 * 0.2 + fVar13;
  if (fVar17 <= fVar16) {
    fVar20 = (local_28[1] - local_18[1]) * 0.2 + local_18[1];
    fVar17 = fVar19 * 0.8 + fVar13;
    fVar16 = 0.0;
    if (fVar17 < fVar20) {
      fVar16 = fVar20 - fVar17;
    }
  }
  else {
    fVar16 = fVar16 - fVar17;
  }
  if (((fVar15 != 0.0) || (NAN(fVar15))) && ((fVar16 != 0.0 || (NAN(fVar16))))) {
    fVar15 = fVar15 / 1000.0 + *(float *)(&DAT_0025dac8 + (ulong)(0.0 < fVar15) * 4);
  }
  fVar11 = (local_28[0] + local_18[0]) - (fVar11 + fVar12);
  fVar12 = (local_28[1] + local_18[1]) - (fVar13 + fVar14);
  fVar13 = ABS(fVar16) + ABS(fVar15);
  fVar14 = ABS(fVar11) + ABS(fVar12);
  if ((fVar16 != 0.0) || (NAN(fVar16))) {
LAB_002009af:
    fVar17 = fVar13;
    uVar8 = (uint)(0.0 < fVar15);
    fVar11 = fVar15;
    fVar12 = fVar16;
    if (ABS(fVar15) <= ABS(fVar16)) {
      uVar8 = 0.0 < fVar16 | 2;
    }
  }
  else {
    if ((fVar15 != 0.0) || (NAN(fVar15))) goto LAB_002009af;
    if ((((fVar11 != 0.0) || (NAN(fVar11))) || (fVar12 != 0.0)) || (NAN(fVar12))) {
      fVar17 = fVar14;
      uVar8 = 0.0 < fVar12 | 2;
      if (ABS(fVar12) < ABS(fVar11)) {
        uVar8 = (uint)(0.0 < fVar11);
      }
    }
    else {
      fVar17 = 0.0;
      uVar8 = (uint)(pIVar6->NavId <= (pIVar6->LastItemData).ID);
      fVar11 = 0.0;
      fVar12 = 0.0;
    }
  }
  uVar4 = pIVar6->NavMoveDir;
  if (uVar8 == uVar4) {
    fVar19 = result->DistBox;
    if (fVar13 < fVar19) {
      result->DistBox = fVar13;
      result->DistCenter = fVar14;
      return true;
    }
    if ((fVar13 == fVar19) && (!NAN(fVar13) && !NAN(fVar19))) {
      fVar13 = result->DistCenter;
      if (fVar14 < fVar13) {
        result->DistCenter = fVar14;
LAB_00200a53:
        bVar7 = true;
        goto LAB_00200a59;
      }
      if ((fVar14 == fVar13) && (!NAN(fVar14) && !NAN(fVar13))) {
        if ((uVar4 & 0xfffffffe) != 2) {
          fVar16 = fVar15;
        }
        if (fVar16 < 0.0) goto LAB_00200a53;
      }
    }
  }
  bVar7 = false;
LAB_00200a59:
  if (((((result->DistBox == 3.4028235e+38) && (!NAN(result->DistBox))) &&
       (fVar17 < result->DistAxial)) &&
      ((pIVar6->NavLayer == ImGuiNavLayer_Menu && ((pIVar6->NavWindow->Flags & 0x10000000) == 0))))
     && (((((uVar4 == 0 && (fVar11 < 0.0)) || ((uVar4 == 1 && (0.0 < fVar11)))) ||
          ((uVar4 == 2 && (fVar12 < 0.0)))) || ((uVar4 == 3 && (0.0 < fVar12)))))) {
    result->DistAxial = fVar17;
    return true;
  }
  return bVar7;
}

Assistant:

static bool ImGui::NavScoreItem(ImGuiNavItemData* result)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavLayer != window->DC.NavLayerCurrent)
        return false;

    // FIXME: Those are not good variables names
    ImRect cand = g.LastItemData.NavRect;   // Current item nav rectangle
    const ImRect curr = g.NavScoringRect;   // Current modified source rect (NB: we've applied Max.x = Min.x in NavUpdate() to inhibit the effect of having varied item width)
    g.NavScoringDebugCount++;

    // When entering through a NavFlattened border, we consider child window items as fully clipped for scoring
    if (window->ParentWindow == g.NavWindow)
    {
        IM_ASSERT((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened);
        if (!window->ClipRect.Overlaps(cand))
            return false;
        cand.ClipWithFull(window->ClipRect); // This allows the scored item to not overlap other candidates in the parent window
    }

    // We perform scoring on items bounding box clipped by the current clipping rectangle on the other axis (clipping on our movement axis would give us equal scores for all clipped items)
    // For example, this ensures that items in one column are not reached when moving vertically from items in another column.
    NavClampRectToVisibleAreaForMoveDir(g.NavMoveClipDir, cand, window->ClipRect);

    // Compute distance between boxes
    // FIXME-NAV: Introducing biases for vertical navigation, needs to be removed.
    float dbx = NavScoreItemDistInterval(cand.Min.x, cand.Max.x, curr.Min.x, curr.Max.x);
    float dby = NavScoreItemDistInterval(ImLerp(cand.Min.y, cand.Max.y, 0.2f), ImLerp(cand.Min.y, cand.Max.y, 0.8f), ImLerp(curr.Min.y, curr.Max.y, 0.2f), ImLerp(curr.Min.y, curr.Max.y, 0.8f)); // Scale down on Y to keep using box-distance for vertically touching items
    if (dby != 0.0f && dbx != 0.0f)
        dbx = (dbx / 1000.0f) + ((dbx > 0.0f) ? +1.0f : -1.0f);
    float dist_box = ImFabs(dbx) + ImFabs(dby);

    // Compute distance between centers (this is off by a factor of 2, but we only compare center distances with each other so it doesn't matter)
    float dcx = (cand.Min.x + cand.Max.x) - (curr.Min.x + curr.Max.x);
    float dcy = (cand.Min.y + cand.Max.y) - (curr.Min.y + curr.Max.y);
    float dist_center = ImFabs(dcx) + ImFabs(dcy); // L1 metric (need this for our connectedness guarantee)

    // Determine which quadrant of 'curr' our candidate item 'cand' lies in based on distance
    ImGuiDir quadrant;
    float dax = 0.0f, day = 0.0f, dist_axial = 0.0f;
    if (dbx != 0.0f || dby != 0.0f)
    {
        // For non-overlapping boxes, use distance between boxes
        dax = dbx;
        day = dby;
        dist_axial = dist_box;
        quadrant = ImGetDirQuadrantFromDelta(dbx, dby);
    }
    else if (dcx != 0.0f || dcy != 0.0f)
    {
        // For overlapping boxes with different centers, use distance between centers
        dax = dcx;
        day = dcy;
        dist_axial = dist_center;
        quadrant = ImGetDirQuadrantFromDelta(dcx, dcy);
    }
    else
    {
        // Degenerate case: two overlapping buttons with same center, break ties arbitrarily (note that LastItemId here is really the _previous_ item order, but it doesn't matter)
        quadrant = (g.LastItemData.ID < g.NavId) ? ImGuiDir_Left : ImGuiDir_Right;
    }

#if IMGUI_DEBUG_NAV_SCORING
    char buf[128];
    if (IsMouseHoveringRect(cand.Min, cand.Max))
    {
        ImFormatString(buf, IM_ARRAYSIZE(buf), "dbox (%.2f,%.2f->%.4f)\ndcen (%.2f,%.2f->%.4f)\nd (%.2f,%.2f->%.4f)\nnav %c, quadrant %c", dbx, dby, dist_box, dcx, dcy, dist_center, dax, day, dist_axial, "WENS"[g.NavMoveDir], "WENS"[quadrant]);
        ImDrawList* draw_list = GetForegroundDrawList(window);
        draw_list->AddRect(curr.Min, curr.Max, IM_COL32(255,200,0,100));
        draw_list->AddRect(cand.Min, cand.Max, IM_COL32(255,255,0,200));
        draw_list->AddRectFilled(cand.Max - ImVec2(4, 4), cand.Max + CalcTextSize(buf) + ImVec2(4, 4), IM_COL32(40,0,0,150));
        draw_list->AddText(cand.Max, ~0U, buf);
    }
    else if (g.IO.KeyCtrl) // Hold to preview score in matching quadrant. Press C to rotate.
    {
        if (quadrant == g.NavMoveDir)
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%.0f/%.0f", dist_box, dist_center);
            ImDrawList* draw_list = GetForegroundDrawList(window);
            draw_list->AddRectFilled(cand.Min, cand.Max, IM_COL32(255, 0, 0, 200));
            draw_list->AddText(cand.Min, IM_COL32(255, 255, 255, 255), buf);
        }
    }
#endif

    // Is it in the quadrant we're interested in moving to?
    bool new_best = false;
    const ImGuiDir move_dir = g.NavMoveDir;
    if (quadrant == move_dir)
    {
        // Does it beat the current best candidate?
        if (dist_box < result->DistBox)
        {
            result->DistBox = dist_box;
            result->DistCenter = dist_center;
            return true;
        }
        if (dist_box == result->DistBox)
        {
            // Try using distance between center points to break ties
            if (dist_center < result->DistCenter)
            {
                result->DistCenter = dist_center;
                new_best = true;
            }
            else if (dist_center == result->DistCenter)
            {
                // Still tied! we need to be extra-careful to make sure everything gets linked properly. We consistently break ties by symbolically moving "later" items
                // (with higher index) to the right/downwards by an infinitesimal amount since we the current "best" button already (so it must have a lower index),
                // this is fairly easy. This rule ensures that all buttons with dx==dy==0 will end up being linked in order of appearance along the x axis.
                if (((move_dir == ImGuiDir_Up || move_dir == ImGuiDir_Down) ? dby : dbx) < 0.0f) // moving bj to the right/down decreases distance
                    new_best = true;
            }
        }
    }

    // Axial check: if 'curr' has no link at all in some direction and 'cand' lies roughly in that direction, add a tentative link. This will only be kept if no "real" matches
    // are found, so it only augments the graph produced by the above method using extra links. (important, since it doesn't guarantee strong connectedness)
    // This is just to avoid buttons having no links in a particular direction when there's a suitable neighbor. you get good graphs without this too.
    // 2017/09/29: FIXME: This now currently only enabled inside menu bars, ideally we'd disable it everywhere. Menus in particular need to catch failure. For general navigation it feels awkward.
    // Disabling it may lead to disconnected graphs when nodes are very spaced out on different axis. Perhaps consider offering this as an option?
    if (result->DistBox == FLT_MAX && dist_axial < result->DistAxial)  // Check axial match
        if (g.NavLayer == ImGuiNavLayer_Menu && !(g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
            if ((move_dir == ImGuiDir_Left && dax < 0.0f) || (move_dir == ImGuiDir_Right && dax > 0.0f) || (move_dir == ImGuiDir_Up && day < 0.0f) || (move_dir == ImGuiDir_Down && day > 0.0f))
            {
                result->DistAxial = dist_axial;
                new_best = true;
            }

    return new_best;
}